

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::PackageComponents(cmCPackDebGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  uint uVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  uint uVar6;
  allocator local_1f1;
  char *local_1f0 [4];
  _Rb_tree_node_base *local_1d0;
  string initialTopLevel;
  ostringstream cmCPackLog_msg;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)local_1f0);
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&initialTopLevel,pcVar3,&local_1f1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (ignoreGroup) {
    uVar6 = 1;
    for (p_Var4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      uVar2 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var4 + 1));
      uVar6 = uVar6 & uVar2;
    }
  }
  else {
    uVar6 = 1;
    local_1d0 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    for (p_Var4 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left; p_Var4 != local_1d0;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Packaging component group: ");
      poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x7b,local_1f0[0]);
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      uVar2 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var4 + 1));
      uVar6 = uVar6 & uVar2;
    }
    for (p_Var4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (*(long *)(p_Var4 + 4) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Component <");
        poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 2));
        poVar5 = std::operator<<(poVar5,"> does not belong to any group, package it separately.");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x89,local_1f0[0]);
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        uVar2 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var4 + 1));
        uVar6 = uVar6 & uVar2;
      }
    }
  }
  std::__cxx11::string::~string((string *)&initialTopLevel);
  return uVar6;
}

Assistant:

int cmCPackDebGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
    for (compGIt = this->ComponentGroups.begin();
         compGIt != this->ComponentGroups.end(); ++compGIt) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Packaging component group: "
                      << compGIt->first << std::endl);
      // Begin the archive for this group
      retval &= PackageOnePack(initialTopLevel, compGIt->first);
    }
    // Handle Orphan components (components not belonging to any groups)
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt = this->Components.begin(); compIt != this->Components.end();
         ++compIt) {
      // Does the component belong to a group?
      if (compIt->second.Group == CM_NULLPTR) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE, "Component <"
            << compIt->second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        // Begin the archive for this orphan component
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt = this->Components.begin(); compIt != this->Components.end();
         ++compIt) {
      retval &= PackageOnePack(initialTopLevel, compIt->first);
    }
  }
  return retval;
}